

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::RemoveFieldInfo::Copy(RemoveFieldInfo *this)

{
  AlterInfo *in_RSI;
  AlterEntryData local_80;
  
  AlterInfo::GetAlterEntryData(&local_80,in_RSI);
  make_uniq_base<duckdb::AlterInfo,duckdb::RemoveFieldInfo,duckdb::AlterEntryData,duckdb::vector<std::__cxx11::string,true>const&,bool_const&,bool_const&>
            ((duckdb *)this,&local_80,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(in_RSI + 1),(bool *)&in_RSI[1].catalog._M_string_length,
             (bool *)((long)&in_RSI[1].catalog._M_string_length + 1));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != &local_80.name.field_2) {
    operator_delete(local_80.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.schema._M_dataplus._M_p != &local_80.schema.field_2) {
    operator_delete(local_80.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.catalog._M_dataplus._M_p != &local_80.catalog.field_2) {
    operator_delete(local_80.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> RemoveFieldInfo::Copy() const {
	return make_uniq_base<AlterInfo, RemoveFieldInfo>(GetAlterEntryData(), column_path, if_column_exists, cascade);
}